

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall
ImplicitDepLoader::ProcessDepfileDeps
          (ImplicitDepLoader *this,Edge *edge,
          vector<StringPiece,_std::allocator<StringPiece>_> *depfile_ins,string *err)

{
  long lVar1;
  pointer pSVar2;
  iterator iVar3;
  Node *this_00;
  size_t *len;
  long lVar4;
  StringPiece path;
  uint64_t slash_bits;
  uint64_t local_38;
  
  iVar3 = PreallocateSpace(this,edge,
                           (int)((ulong)((long)(depfile_ins->
                                               super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(depfile_ins->
                                              super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                              )._M_impl.super__Vector_impl_data._M_start) >> 4));
  pSVar2 = (depfile_ins->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar2 != (depfile_ins->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
    lVar4 = 0;
    do {
      len = (size_t *)((long)&pSVar2->len_ + lVar4 * 2);
      CanonicalizePath((char *)len[-1],len,&local_38);
      path.len_ = *len;
      path.str_ = (char *)len[-1];
      this_00 = State::GetNode(this->state_,path,local_38);
      *(Node **)((long)iVar3._M_current + lVar4) = this_00;
      Node::AddOutEdge(this_00,edge);
      CreatePhonyInEdge(this,this_00);
      lVar1 = lVar4 * 2;
      lVar4 = lVar4 + 8;
    } while ((pointer)((long)&pSVar2[1].str_ + lVar1) !=
             (depfile_ins->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return true;
}

Assistant:

bool ImplicitDepLoader::ProcessDepfileDeps(
    Edge* edge, std::vector<StringPiece>* depfile_ins, std::string* err) {
  // Preallocate space in edge->inputs_ to be filled in below.
  vector<Node*>::iterator implicit_dep =
      PreallocateSpace(edge, depfile_ins->size());

  // Add all its in-edges.
  for (std::vector<StringPiece>::iterator i = depfile_ins->begin();
       i != depfile_ins->end(); ++i, ++implicit_dep) {
    uint64_t slash_bits;
    CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits);
    Node* node = state_->GetNode(*i, slash_bits);
    *implicit_dep = node;
    node->AddOutEdge(edge);
    CreatePhonyInEdge(node);
  }

  return true;
}